

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString> *this)

{
  QString::~QString((QString *)0x6f59f0);
  QStringBuilder<QString,_QLatin1String>::~QStringBuilder
            ((QStringBuilder<QString,_QLatin1String> *)0x6f59fa);
  return;
}

Assistant:

~QStringBuilder() = default;